

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureSwizzleCase::test
          (TextureSwizzleCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  GLint param;
  uint uVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  GLuint expected;
  long lVar6;
  GLint value;
  ScopedLogSection section;
  ScopedLogSection section_1;
  allocator<char> local_f5;
  GLuint local_f4;
  ResultCollector *local_f0;
  code *local_e8;
  GLenum local_e0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  ScopedLogSection local_38;
  
  tester = (this->super_TextureTest).m_tester;
  local_f0 = result;
  bVar3 = isPureIntTester(tester);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(tester);
  }
  GVar5 = (this->super_TextureTest).m_pname;
  uVar1 = GVar5 - 0x753f;
  if (2 < GVar5 - 0x8e42) {
    uVar1 = -(uint)(GVar5 != 0x8e45) | 0x1906;
  }
  if (bVar4 == false) {
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Initial",(allocator<char> *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Initial",(allocator<char> *)&local_58);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_98,pTVar2,&local_78,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    StateQueryUtil::verifyStateTextureParamInteger
              (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               uVar1,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_98);
  }
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Set",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Set",(allocator<char> *)&local_b8);
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar2,&local_78,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar4 == false) {
    for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 4) {
      param = *(GLint *)((long)&DAT_00a27550 + lVar6);
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,param);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Got Error ",(allocator<char> *)&local_f4);
        local_e8 = glu::getErrorName;
        local_e0 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
        std::operator+(&local_98,&local_b8,&local_58);
        std::operator+(&local_d8,&local_98,": ");
        std::operator+(&local_78,&local_d8,"glTexParameteri");
        tcu::ResultCollector::fail(local_f0,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 param,(this->super_TextureTest).m_type);
    }
    for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 4) {
      uVar1 = *(uint *)((long)&DAT_00a27550 + lVar6);
      glu::CallLogWrapper::glTexParameterf
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (float)uVar1);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Got Error ",(allocator<char> *)&local_f4);
        local_e8 = glu::getErrorName;
        local_e0 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
        std::operator+(&local_98,&local_b8,&local_58);
        std::operator+(&local_d8,&local_98,": ");
        std::operator+(&local_78,&local_d8,"glTexParameterf");
        tcu::ResultCollector::fail(local_f0,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 uVar1,(this->super_TextureTest).m_type);
    }
  }
  else {
    for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 4) {
      bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
      if (bVar3) {
        expected = *(GLuint *)((long)&DAT_00a27550 + lVar6);
        local_f4 = expected;
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (GLint *)&local_f4);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Got Error ",&local_f5);
          local_e8 = glu::getErrorName;
          local_e0 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
          std::operator+(&local_98,&local_b8,&local_58);
          std::operator+(&local_d8,&local_98,": ");
          std::operator+(&local_78,&local_d8,"glTexParameterIiv");
          tcu::ResultCollector::fail(local_f0,&local_78);
LAB_0083ab5b:
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_b8);
        }
      }
      else {
        expected = *(GLuint *)((long)&DAT_00a27550 + lVar6);
        local_f4 = expected;
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_f4
                  );
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Got Error ",&local_f5);
          local_e8 = glu::getErrorName;
          local_e0 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_e8);
          std::operator+(&local_98,&local_b8,&local_58);
          std::operator+(&local_d8,&local_98,": ");
          std::operator+(&local_78,&local_d8,"glTexParameterIuiv");
          tcu::ResultCollector::fail(local_f0,&local_78);
          goto LAB_0083ab5b;
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 expected,(this->super_TextureTest).m_type);
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_38);
  return;
}

Assistant:

void TextureSwizzleCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_SWIZZLE_R) ? (GL_RED) :
								  (m_pname == GL_TEXTURE_SWIZZLE_G) ? (GL_GREEN) :
								  (m_pname == GL_TEXTURE_SWIZZLE_B) ? (GL_BLUE) :
								  (m_pname == GL_TEXTURE_SWIZZLE_A) ? (GL_ALPHA) :
								  (-1);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const GLenum				swizzleValues[]	= {GL_RED, GL_GREEN, GL_BLUE, GL_ALPHA, GL_ZERO, GL_ONE};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)swizzleValues[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = swizzleValues[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, swizzleValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)swizzleValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}
		}
	}
}